

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_close_twice_open_filename.c
# Opt level: O2

void test_archive_read_close_twice_open_filename(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *_a;
  char *pcVar3;
  
  _a = archive_read_new();
  iVar1 = archive_read_support_format_empty(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'!',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_empty(a)",
                      (void *)0x0);
  wVar2 = archive_read_open_filename(_a,(char *)0x0,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'\"',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, 0, 0)",
                      (void *)0x0);
  iVar1 = archive_errno(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'#',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
             ,L'$',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_errno(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'\'',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
             ,L'(',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_errno(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'+',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
             ,L',',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_close_twice_open_filename)
{
	struct archive* a = archive_read_new();

	assertEqualInt(ARCHIVE_OK, archive_read_support_format_empty(a));
	assertEqualInt(ARCHIVE_OK, archive_read_open_filename(a, 0, 0));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}